

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O3

art_erase_result_t *
art_erase_at(art_erase_result_t *__return_storage_ptr__,art_t *art,art_ref_t ref,
            art_key_chunk_t *key,uint8_t depth)

{
  byte bVar1;
  art_key_chunk_t key_chunk;
  art_erase_result_t *paVar2;
  art_erase_result_t *ref_00;
  art_erase_result_t *extraout_RAX;
  long lVar3;
  art_typecode_t typecode;
  art_typecode_t typecode_00;
  byte bVar4;
  ulong uVar5;
  art_inner_node_t *paVar6;
  ulong uVar7;
  long lVar8;
  art_erase_result_t child_result;
  art_erase_result_t local_48;
  
  __return_storage_ptr__->rootmost_node = 0;
  __return_storage_ptr__->erased = false;
  typecode_00 = (art_typecode_t)ref;
  uVar7 = ref & 0xff;
  if (uVar7 == 1) {
    paVar2 = (art_erase_result_t *)((ref >> 0xc & 0xfffffffffffffff0) + (long)art->nodes[1]);
    lVar3 = 0;
    do {
      if (*(art_key_chunk_t *)((long)&paVar2->rootmost_node + lVar3) != key[lVar3]) {
        if (lVar3 != 6) {
          return paVar2;
        }
        break;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 6);
    __return_storage_ptr__->erased = true;
    __return_storage_ptr__->value_erased = *(art_val_t *)&paVar2->erased;
    paVar2->rootmost_node = art->first_free[1];
    art->first_free[1] = ref >> 0x10;
  }
  else {
    uVar5 = (ulong)(uint)((int)uVar7 * 8);
    lVar3 = *(long *)((long)art->nodes + uVar5);
    lVar8 = (ref >> 0x10) * *(long *)((long)ART_NODE_SIZES + uVar5);
    bVar1 = *(byte *)(lVar3 + lVar8);
    paVar6 = (art_inner_node_t *)(lVar3 + lVar8);
    bVar4 = 6 - depth;
    if (bVar1 <= (byte)(6 - depth)) {
      bVar4 = bVar1;
    }
    if (bVar4 == 0) {
      bVar4 = 0;
    }
    else {
      uVar5 = 0;
      do {
        if (paVar6->prefix[uVar5] != key[uVar5 + depth]) {
          bVar4 = (byte)uVar5;
          break;
        }
        uVar5 = uVar5 + 1;
      } while (bVar4 != uVar5);
    }
    paVar2 = (art_erase_result_t *)(ulong)bVar1;
    if (bVar4 == bVar1) {
      lVar3 = (long)&((art_erase_result_t *)(ulong)bVar1)->rootmost_node + (ulong)depth;
      key_chunk = key[lVar3];
      ref_00 = (art_erase_result_t *)art_find_child(paVar6,typecode_00,key_chunk);
      paVar2 = ref_00;
      if (ref_00 != (art_erase_result_t *)0x0) {
        art_erase_at(&local_48,art,(art_ref_t)ref_00,key,(char)lVar3 + '\x01');
        paVar2 = &local_48;
        if (local_48.erased == true) {
          __return_storage_ptr__->erased = true;
          __return_storage_ptr__->value_erased = local_48.value_erased;
          __return_storage_ptr__->rootmost_node = ref;
          paVar6 = (art_inner_node_t *)(lVar8 + (long)art->nodes[uVar7]);
          if ((art_erase_result_t *)local_48.rootmost_node == (art_erase_result_t *)0x0) {
            paVar2 = (art_erase_result_t *)art_node_erase(art,paVar6,typecode_00,key_chunk);
            __return_storage_ptr__->rootmost_node = (art_ref_t)paVar2;
          }
          else {
            paVar2 = (art_erase_result_t *)local_48.value_erased;
            if ((art_erase_result_t *)local_48.rootmost_node != ref_00) {
              art_replace(paVar6,typecode_00,key_chunk,local_48.rootmost_node);
              paVar2 = extraout_RAX;
            }
          }
        }
      }
    }
  }
  return paVar2;
}

Assistant:

static art_erase_result_t art_erase_at(art_t *art, art_ref_t ref,
                                       const art_key_chunk_t *key,
                                       uint8_t depth) {
    art_erase_result_t result;
    result.rootmost_node = CROARING_ART_NULL_REF;
    result.erased = false;

    if (art_is_leaf(ref)) {
        art_leaf_t *leaf = (art_leaf_t *)art_deref(art, ref);
        uint8_t common_prefix = art_common_prefix(leaf->key, 0, ART_KEY_BYTES,
                                                  key, 0, ART_KEY_BYTES);
        if (common_prefix != ART_KEY_BYTES) {
            // Leaf key mismatch.
            return result;
        }
        result.erased = true;
        result.value_erased = leaf->val;
        art_node_free(art, (art_node_t *)leaf, CROARING_ART_LEAF_TYPE);
        return result;
    }
    art_inner_node_t *inner_node = (art_inner_node_t *)art_deref(art, ref);
    uint8_t common_prefix =
        art_common_prefix(inner_node->prefix, 0, inner_node->prefix_size, key,
                          depth, ART_KEY_BYTES);
    if (common_prefix != inner_node->prefix_size) {
        // Prefix mismatch.
        return result;
    }
    art_key_chunk_t key_chunk = key[depth + common_prefix];
    art_ref_t child =
        art_find_child(inner_node, art_ref_typecode(ref), key_chunk);
    if (child == CROARING_ART_NULL_REF) {
        // No child with key chunk.
        return result;
    }
    // Try to erase the key further down. Skip the key chunk associated with
    // the child in the node.
    art_erase_result_t child_result =
        art_erase_at(art, child, key, depth + common_prefix + 1);
    if (!child_result.erased) {
        return result;
    }
    result.erased = true;
    result.value_erased = child_result.value_erased;
    result.rootmost_node = ref;

    // Deref again as nodes may have changed location.
    inner_node = (art_inner_node_t *)art_deref(art, ref);
    if (child_result.rootmost_node == CROARING_ART_NULL_REF) {
        // Child node was fully erased, erase it from this node's children.
        result.rootmost_node =
            art_node_erase(art, inner_node, art_ref_typecode(ref), key_chunk);
    } else if (child_result.rootmost_node != child) {
        // Child node was not fully erased, update the pointer to it in this
        // node.
        art_replace(inner_node, art_ref_typecode(ref), key_chunk,
                    child_result.rootmost_node);
    }
    return result;
}